

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

QString * formatBacktraceForLogMessage(BacktraceParams *backtraceParams,QMessageLogContext *ctx)

{
  bool bVar1;
  const_reference this;
  reference this_00;
  QByteArray *in_RDX;
  char *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int backtraceDepth;
  QInternalMessageLogContext *fullctx;
  QStringList frames;
  QString backtraceSeparator;
  QString *in_stack_fffffffffffffee8;
  QList<QString> *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  QListSpecialMethods<QString> *this_01;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  QString *this_02;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar3;
  int frameCount;
  QByteArray *info;
  QChar local_4a;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QListSpecialMethods<QString> *local_38;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&(in_RDX->d).d < 3) {
    QString::QString((QString *)0x2486ed);
  }
  else {
    this_02 = in_RDI;
    info = in_RDX;
    bVar1 = std::optional<QVarLengthArray<void_*,_32LL>_>::has_value
                      ((optional<QVarLengthArray<void_*,_32LL>_> *)0x248719);
    frameCount = (int)((ulong)in_RDX >> 0x20);
    if (bVar1) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      this_01 = (QListSpecialMethods<QString> *)&DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      uVar2 = *(undefined4 *)(in_RSI + 0x18);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      uVar3 = uVar2;
      local_38 = this_01;
      std::optional<QVarLengthArray<void_*,_32LL>_>::operator*
                ((optional<QVarLengthArray<void_*,_32LL>_> *)0x2487a2);
      backtraceFramesForLogMessage
                (frameCount,(BacktraceStorage *)CONCAT44(uVar3,in_stack_ffffffffffffff40));
      bVar1 = QList<QString>::isEmpty((QList<QString> *)0x2487c5);
      if (bVar1) {
        QString::QString((QString *)0x2487d5);
      }
      else {
        if ((info->d).size != 0) {
          this = QList<QString>::at(in_stack_fffffffffffffef0,(qsizetype)in_stack_fffffffffffffee8);
          QChar::QChar<char16_t,_true>(&local_4a,L'?');
          in_stack_ffffffffffffff07 =
               QString::startsWith(this,(QChar)(char16_t)((ulong)this_01 >> 0x30),
                                   (CaseSensitivity)((ulong)in_stack_fffffffffffffef0 >> 0x20));
          if ((bool)in_stack_ffffffffffffff07) {
            QByteArray::QByteArray
                      ((QByteArray *)this_02,in_RSI,CONCAT44(uVar2,in_stack_ffffffffffffff10));
            qCleanupFuncinfo(info);
            QString::fromUtf8<void>((QByteArray *)in_stack_fffffffffffffef0);
            this_00 = QList<QString>::operator[]
                                (in_stack_fffffffffffffef0,(qsizetype)in_stack_fffffffffffffee8);
            QString::operator=(this_00,in_stack_fffffffffffffee8);
            QString::~QString((QString *)0x2488df);
            QByteArray::~QByteArray((QByteArray *)0x2488ec);
            QByteArray::~QByteArray((QByteArray *)0x2488f9);
          }
        }
        QListSpecialMethods<QString>::join
                  (this_01,(QString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00))
        ;
      }
      QList<QString>::~QList((QList<QString> *)0x2489a6);
      QString::~QString((QString *)0x2489b3);
    }
    else {
      QString::QString((QString *)0x248727);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QString formatBacktraceForLogMessage(const QMessagePattern::BacktraceParams backtraceParams,
                                            const QMessageLogContext &ctx)
{
    // do we have a backtrace stored?
    if (ctx.version <= QMessageLogContext::CurrentVersion)
        return QString();

    auto &fullctx = static_cast<const QInternalMessageLogContext &>(ctx);
    if (!fullctx.backtrace.has_value())
        return QString();

    QString backtraceSeparator = backtraceParams.backtraceSeparator;
    int backtraceDepth = backtraceParams.backtraceDepth;

    QStringList frames = backtraceFramesForLogMessage(backtraceDepth, *fullctx.backtrace);
    if (frames.isEmpty())
        return QString();

    // if the first frame is unknown, replace it with the context function
    if (ctx.function && frames.at(0).startsWith(u'?'))
        frames[0] = QString::fromUtf8(qCleanupFuncinfo(ctx.function));

    return frames.join(backtraceSeparator);
}